

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

string * __thiscall
Diligent::Parsing::GetContext<char_const*>
          (string *__return_storage_ptr__,Parsing *this,char **Start,char **End,char *Pos,
          size_t NumLines)

{
  bool bVar1;
  Char *pCVar2;
  undefined8 Args_1;
  char (*Args_1_00) [45];
  byte local_24b;
  byte local_249;
  char *local_230;
  size_t LineBelow;
  char *CtxEnd;
  size_t i;
  string msg_1;
  string msg;
  size_t LineAbove;
  stringstream Ctx;
  ostream local_1c0 [376];
  char *local_48;
  size_t CharPos;
  char *CtxStart;
  char *local_30;
  size_t NumLines_local;
  char *Pos_local;
  char **End_local;
  char **Start_local;
  
  CharPos = (size_t)End;
  local_30 = Pos;
  NumLines_local = (size_t)End;
  Pos_local = (char *)Start;
  End_local = (char **)this;
  Start_local = (char **)__return_storage_ptr__;
  if (*(char **)this == *Start) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&CtxStart + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&CtxStart + 7));
  }
  else {
    while( true ) {
      local_249 = 0;
      if (*End_local < CharPos) {
        bVar1 = IsNewLine(*(Char *)(CharPos - 1));
        local_249 = bVar1 ^ 0xff;
      }
      if ((local_249 & 1) == 0) break;
      CharPos = CharPos - 1;
    }
    local_48 = (char *)(NumLines_local - CharPos);
    NumLines_local =
         (size_t)SkipLine<char_const*>((char **)&NumLines_local,(char **)Pos_local,false);
    std::__cxx11::stringstream::stringstream((stringstream *)&LineAbove);
    msg.field_2._8_8_ = 0;
    while( true ) {
      bVar1 = false;
      Args_1 = msg.field_2._8_8_;
      if ((ulong)msg.field_2._8_8_ < local_30) {
        bVar1 = *End_local < CharPos;
        Args_1 = End_local;
      }
      if (!bVar1) break;
      bVar1 = IsNewLine(*(Char *)(CharPos - 1));
      if (!bVar1) {
        FormatString<char[26],char[24]>
                  ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])0x47182f,(char (*) [24])Args_1);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"GetContext",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                   ,0x212);
        std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      }
      if (((*(char *)(CharPos - 1) == '\n') && (*End_local + 1 < CharPos)) &&
         (*(char *)(CharPos - 2) == '\r')) {
        CharPos = CharPos - 1;
      }
      if (*End_local < CharPos) {
        CharPos = CharPos - 1;
      }
      while( true ) {
        local_24b = 0;
        if (*End_local < CharPos) {
          bVar1 = IsNewLine(*(Char *)(CharPos - 1));
          local_24b = bVar1 ^ 0xff;
        }
        if ((local_24b & 1) == 0) break;
        CharPos = CharPos - 1;
      }
      msg.field_2._8_8_ = msg.field_2._8_8_ + 1;
    }
    if (((char *)CharPos != *End_local) &&
       (Args_1_00 = (char (*) [45])End_local, bVar1 = IsNewLine(*(Char *)(CharPos - 1)), !bVar1)) {
      FormatString<char[26],char[45]>
                ((string *)&i,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CtxStart == Start || IsNewLine(CtxStart[-1])",Args_1_00);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"GetContext",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                 ,0x21b);
      std::__cxx11::string::~string((string *)&i);
    }
    std::ostream::write((char *)local_1c0,CharPos);
    std::ostream::operator<<(local_1c0,std::endl<char,std::char_traits<char>>);
    for (CtxEnd = (char *)0x0; CtxEnd < local_48; CtxEnd = CtxEnd + 1) {
      std::operator<<(local_1c0,' ');
    }
    std::operator<<(local_1c0,'^');
    if (NumLines_local != *(size_t *)Pos_local) {
      LineBelow = NumLines_local;
      local_230 = (char *)0x0;
      while( true ) {
        bVar1 = false;
        if ((local_230 < local_30) && (bVar1 = false, LineBelow != *(size_t *)Pos_local)) {
          bVar1 = *(char *)LineBelow != '\0';
        }
        if (!bVar1) break;
        if (((*(char *)LineBelow == '\r') && (LineBelow + 1 != *(long *)Pos_local)) &&
           (*(char *)(LineBelow + 1) == '\n')) {
          LineBelow = LineBelow + 1;
        }
        if (LineBelow != *(size_t *)Pos_local) {
          LineBelow = LineBelow + 1;
        }
        LineBelow = (size_t)SkipLine<char_const*>((char **)&LineBelow,(char **)Pos_local,false);
        local_230 = local_230 + 1;
      }
      std::ostream::write((char *)local_1c0,NumLines_local);
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&LineAbove);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetContext(const IteratorType& Start, const IteratorType& End, IteratorType Pos, size_t NumLines) noexcept
{
    if (Start == End)
        return "";

    auto CtxStart = Pos;
    while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
        --CtxStart;
    const size_t CharPos = Pos - CtxStart; // Position of the character in the line

    Pos = SkipLine(Pos, End);

    std::stringstream Ctx;
    {
        size_t LineAbove = 0;
        while (LineAbove < NumLines && CtxStart > Start)
        {
            VERIFY_EXPR(IsNewLine(CtxStart[-1]));
            if (CtxStart[-1] == '\n' && CtxStart > Start + 1 && CtxStart[-2] == '\r')
                --CtxStart;
            if (CtxStart > Start)
                --CtxStart;
            while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
                --CtxStart;
            ++LineAbove;
        }
        VERIFY_EXPR(CtxStart == Start || IsNewLine(CtxStart[-1]));
        Ctx.write(&*CtxStart, Pos - CtxStart);
    }

    Ctx << std::endl;
    for (size_t i = 0; i < CharPos; ++i)
        Ctx << ' ';
    Ctx << '^';

    if (Pos != End)
    {
        auto   CtxEnd    = Pos;
        size_t LineBelow = 0;
        while (LineBelow < NumLines && CtxEnd != End && *CtxEnd != '\0')
        {
            if (*CtxEnd == '\r' && CtxEnd + 1 != End && CtxEnd[+1] == '\n')
                ++CtxEnd;
            if (CtxEnd != End)
                ++CtxEnd;
            CtxEnd = SkipLine(CtxEnd, End);
            ++LineBelow;
        }
        Ctx.write(&*Pos, CtxEnd - Pos);
    }

    return Ctx.str();
}